

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

void __thiscall PSEngine::print_subturns_history(PSEngine *this)

{
  AbsoluteDirection AVar1;
  ObjectDeltaType p_enum_value;
  long lVar2;
  pointer pPVar3;
  element_type *peVar4;
  pointer pRVar5;
  PatternMatchInformation *m;
  pointer pRVar6;
  pointer pPVar7;
  pointer pMVar8;
  ulong uVar9;
  pointer pSVar10;
  allocator<char> local_242;
  allocator<char> local_241;
  string rule_match_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  PSEngine *local_200;
  pointer local_1f8;
  pointer local_1f0;
  string result;
  string local_1c8;
  pointer local_1a8;
  string local_1a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  ulong local_138;
  pointer local_130;
  pointer local_128;
  string local_120;
  string local_100 [32];
  string local_e0 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
  local_60;
  
  local_200 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&local_180);
  uVar9 = 0;
  while (pSVar10 = (local_200->m_turn_history).subturns.
                   super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)(local_200->m_turn_history).subturns.
                               super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10) / 0x18))
  {
    local_138 = uVar9 + 1;
    std::__cxx11::to_string(&local_1c8,(int)local_138);
    std::operator+(&local_220,"--- Subturn ",&local_1c8);
    std::operator+(&local_158,&local_220,"/");
    std::__cxx11::to_string
              (&local_1a0,
               ((long)(local_200->m_turn_history).subturns.
                      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_200->m_turn_history).subturns.
                     super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::operator+(&rule_match_str,&local_158,&local_1a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                   &rule_match_str,"---\n");
    std::__cxx11::string::append((string *)&result);
    pSVar10 = pSVar10 + uVar9;
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&rule_match_str);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1c8);
    local_130 = (pSVar10->steps).
                super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pRVar6 = *(pointer *)
              &(pSVar10->steps).
               super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>;
    while (uVar9 = local_138, pRVar6 != local_130) {
      local_1a8 = pRVar6;
      if (pRVar6->is_movement_resolution == true) {
        std::__cxx11::string::append((char *)&result);
        local_1f0 = (pRVar6->movement_deltas).
                    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (pMVar8 = *(pointer *)
                       &(pRVar6->movement_deltas).
                        super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                        ._M_impl; pMVar8 != local_1f0; pMVar8 = pMVar8 + 1) {
          std::__cxx11::string::append((char *)&result);
          lVar2 = (long)(pMVar8->object).
                        super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          if (lVar2 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rule_match_str,"nullptr",&local_241);
          }
          else {
            std::__cxx11::string::string((string *)&rule_match_str,(string *)(lVar2 + 0x18));
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_180,&rule_match_str," ");
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&rule_match_str);
          AVar1 = *(AbsoluteDirection *)
                   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pMVar8->move_direction)->_M_pi;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::_Rb_tree(&local_60,&to_absolute_direction_abi_cxx11_._M_t);
          enum_to_str<PSEngine::AbsoluteDirection>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_180,AVar1,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                      *)&local_60);
          std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                    (&local_158,(optional<std::__cxx11::string> *)&local_180,(char (*) [6])"ERROR");
          std::operator+(&rule_match_str,"moved ",&local_158);
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&rule_match_str);
          std::__cxx11::string::~string((string *)&local_158);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_180);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::~_Rb_tree(&local_60);
          std::__cxx11::to_string(&local_220,(pMVar8->origin).x);
          std::operator+(&local_158," from (",&local_220);
          std::operator+(&rule_match_str,&local_158,",");
          std::__cxx11::to_string(&local_1c8,(pMVar8->origin).y);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_180,&rule_match_str,&local_1c8);
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&rule_match_str);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::to_string
                    (&local_1c8,
                     *(int *)&(((shared_ptr<CompiledGame::PrimaryObject> *)&pMVar8->destination)->
                              super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
          std::operator+(&local_220,") to (",&local_1c8);
          std::operator+(&local_158,&local_220,",");
          std::__cxx11::to_string
                    (&local_1a0,
                     *(int *)((long)&(((shared_ptr<CompiledGame::PrimaryObject> *)
                                      &pMVar8->destination)->
                                     super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + 4));
          std::operator+(&rule_match_str,&local_158,&local_1a0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_180,&rule_match_str,")\n");
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&rule_match_str);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
      }
      else {
        CompiledGame::Rule::to_string_abi_cxx11_(&rule_match_str,&pRVar6->rule_applied,false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,&rule_match_str,"\n");
        std::__cxx11::string::append((string *)&result);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&rule_match_str);
        local_128 = (local_1a8->rule_application_deltas).
                    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pRVar5 = *(pointer *)
                  &(local_1a8->rule_application_deltas).
                   super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                   ._M_impl;
        while (pRVar5 != local_128) {
          AVar1 = pRVar5->rule_direction;
          local_1f8 = pRVar5;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::_Rb_tree(&local_90,&to_absolute_direction_abi_cxx11_._M_t);
          enum_to_str<PSEngine::AbsoluteDirection>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_180,AVar1,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                      *)&local_90);
          std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                    (&rule_match_str,(optional<std::__cxx11::string> *)&local_180,
                     (char (*) [6])0x13c18e);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_180);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::~_Rb_tree(&local_90);
          pPVar3 = (local_1f8->match_infos).
                   super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar7 = *(pointer *)
                         &(local_1f8->match_infos).
                          super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                          ._M_impl; pPVar7 != pPVar3; pPVar7 = pPVar7 + 1) {
            std::__cxx11::to_string(&local_1a0,(pPVar7->origin).x);
            std::operator+(&local_1c8," (",&local_1a0);
            std::operator+(&local_220,&local_1c8,",");
            std::__cxx11::to_string(&local_120,(pPVar7->origin).y);
            std::operator+(&local_158,&local_220,&local_120);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,&local_158,") ");
            std::__cxx11::string::append((string *)&rule_match_str);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          std::operator+(&local_158,"\t",&rule_match_str);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_180,&local_158,"\n");
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_158);
          local_1f0 = (pointer)(local_1f8->object_deltas).
                               super__Vector_base<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          for (pMVar8 = *(pointer *)
                         &(local_1f8->object_deltas).
                          super__Vector_base<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>
                          ._M_impl; pMVar8 != local_1f0;
              pMVar8 = (pointer)&(pMVar8->object).
                                 super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount) {
            std::__cxx11::to_string(&local_1a0,(pMVar8->origin).x);
            std::operator+(&local_1c8,"\t\t",&local_1a0);
            std::operator+(&local_220,&local_1c8,",");
            std::__cxx11::to_string(&local_120,(pMVar8->origin).y);
            std::operator+(&local_158,&local_220,&local_120);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,&local_158," ");
            std::__cxx11::string::append((string *)&result);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1a0);
            lVar2 = (long)(((shared_ptr<CompiledGame::PrimaryObject> *)&pMVar8->destination)->
                          super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr;
            if (lVar2 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_158,"nullptr",&local_242);
            }
            else {
              std::__cxx11::string::string((string *)&local_158,(string *)(lVar2 + 0x18));
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,&local_158," ");
            std::__cxx11::string::append((string *)&result);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_158);
            p_enum_value = *(ObjectDeltaType *)
                            &(pMVar8->object).
                             super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
            ::_Rb_tree(&local_c0,&CompiledGame::to_object_delta_type_abi_cxx11_._M_t);
            enum_to_str<CompiledGame::ObjectDeltaType>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_180,p_enum_value,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
                        *)&local_c0);
            std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                      (&local_220,(optional<std::__cxx11::string> *)&local_180,(char (*) [6])"ERROR"
                      );
            std::operator+(&local_158,&local_220,"\n");
            std::__cxx11::string::append((string *)&result);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_220);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_180);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
            ::~_Rb_tree(&local_c0);
          }
          std::__cxx11::string::~string((string *)&rule_match_str);
          pRVar5 = local_1f8 + 1;
        }
      }
      pRVar6 = local_1a8 + 1;
    }
  }
  if ((int)(local_200->m_config).log_verbosity < 3) {
    peVar4 = (local_200->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_e0,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::string::string(local_100,(string *)&result);
    (*peVar4->_vptr_PSLogger[2])(peVar4,2,local_e0,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
  }
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void PSEngine::print_subturns_history() const
{
    string result = "";
    for(int i = 0; i < m_turn_history.subturns.size(); ++i)
    {
        const auto& subturn = m_turn_history.subturns[i];
        result += "--- Subturn " + to_string(i+1) + "/" + to_string(m_turn_history.subturns.size()) + "---\n";
        for(const auto& rule_delta : subturn.steps)
        {
            if(rule_delta.is_movement_resolution)
            {
                result += "Movement Resolution\n";
                for(const auto& move_delta : rule_delta.movement_deltas)
                {
                    result += "\t";
                    result += (move_delta.object.get() != nullptr ? move_delta.object->identifier : "nullptr") + " ";
                    result += "moved " + enum_to_str(move_delta.move_direction,to_absolute_direction).value_or("ERROR");
                    result += " from ("+ to_string(move_delta.origin.x)+","+to_string(move_delta.origin.y);
                    result += ") to ("+to_string(move_delta.destination.x)+","+to_string(move_delta.destination.y)+")\n";
                }
            }
            else
            {
                result += rule_delta.rule_applied.to_string()+"\n";
                for(const auto& rule_app_delta : rule_delta.rule_application_deltas)
                {
                    string rule_match_str = enum_to_str(rule_app_delta.rule_direction, to_absolute_direction).value_or("error");
                    for(const auto& m : rule_app_delta.match_infos)
                    {
                        rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                    }

                    result += "\t" + rule_match_str + "\n";
                    for(const auto& object_delta : rule_app_delta.object_deltas)
                    {
                        result += "\t\t" + to_string(object_delta.cell_position.x)+","+to_string(object_delta.cell_position.y)+" ";
                        result += (object_delta.object.get() != nullptr ? object_delta.object->identifier : "nullptr") + " ";
                        result += enum_to_str(object_delta.type,CompiledGame::to_object_delta_type).value_or("ERROR") + "\n";
                    }
                }
            }
        }
    }

    PS_LOG(result);
}